

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O0

int channelCount(Header *h)

{
  bool bVar1;
  ConstIterator *x;
  ConstIterator i;
  int channels;
  ConstIterator *in_stack_ffffffffffffffd8;
  undefined4 local_c;
  
  local_c = 0;
  Imf_3_4::Header::channels();
  Imf_3_4::ChannelList::begin();
  while( true ) {
    Imf_3_4::Header::channels();
    x = (ConstIterator *)Imf_3_4::ChannelList::end();
    bVar1 = Imf_3_4::operator!=(x,in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    local_c = local_c + 1;
    Imf_3_4::ChannelList::ConstIterator::operator++(x);
  }
  return local_c;
}

Assistant:

int
channelCount (const Header& h)
{
    int channels = 0;
    for (ChannelList::ConstIterator i = h.channels ().begin ();
         i != h.channels ().end ();
         ++i)
    {
        ++channels;
    }
    return channels;
}